

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZDICT_addEntropyTablesFromBuffer_advanced
                 (void *dictBuffer,size_t dictContentSize,size_t dictBufferCapacity,
                 void *samplesBuffer,size_t *samplesSizes,uint nbSamples,ZDICT_params_t params)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  XXH64_hash_t XVar4;
  size_t sVar5;
  uint uVar6;
  XXH64_hash_t seed;
  int compressionLevel;
  void *dictBuffer_00;
  
  compressionLevel = 3;
  if (params.compressionLevel != 0) {
    compressionLevel = params.compressionLevel;
  }
  if (1 < params.notificationLevel) {
    fprintf(_stderr,"\r%70s\r","");
    fflush(_stderr);
    fwrite("statistics ... \n",0x10,1,_stderr);
    fflush(_stderr);
  }
  dictBuffer_00 = (void *)((long)dictBuffer + (dictBufferCapacity - dictContentSize));
  sVar3 = ZDICT_analyzeEntropy
                    ((void *)((long)dictBuffer + 8),dictBufferCapacity - 8,compressionLevel,
                     samplesBuffer,samplesSizes,nbSamples,dictBuffer_00,dictContentSize,
                     params.notificationLevel);
  sVar5 = sVar3;
  if (sVar3 < 0xffffffffffffff89) {
    *(undefined4 *)dictBuffer = 0xec30a437;
    XVar4 = XXH_INLINE_XXH64(dictBuffer_00,dictContentSize,seed);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = XVar4;
    uVar6 = SUB164(auVar2 % ZEXT816(0x7fff8000),0) + 0x8000;
    if (params.dictID != 0) {
      uVar6 = params.dictID;
    }
    *(uint *)((long)dictBuffer + 4) = uVar6;
    uVar1 = sVar3 + 8 + dictContentSize;
    sVar5 = dictBufferCapacity;
    if (uVar1 < dictBufferCapacity) {
      memmove((void *)((long)dictBuffer + sVar3 + 8),dictBuffer_00,dictContentSize);
      sVar5 = uVar1;
    }
  }
  return sVar5;
}

Assistant:

static size_t ZDICT_addEntropyTablesFromBuffer_advanced(
        void* dictBuffer, size_t dictContentSize, size_t dictBufferCapacity,
        const void* samplesBuffer, const size_t* samplesSizes, unsigned nbSamples,
        ZDICT_params_t params)
{
    int const compressionLevel = (params.compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT : params.compressionLevel;
    U32 const notificationLevel = params.notificationLevel;
    size_t hSize = 8;

    /* calculate entropy tables */
    DISPLAYLEVEL(2, "\r%70s\r", "");   /* clean display line */
    DISPLAYLEVEL(2, "statistics ... \n");
    {   size_t const eSize = ZDICT_analyzeEntropy((char*)dictBuffer+hSize, dictBufferCapacity-hSize,
                                  compressionLevel,
                                  samplesBuffer, samplesSizes, nbSamples,
                                  (char*)dictBuffer + dictBufferCapacity - dictContentSize, dictContentSize,
                                  notificationLevel);
        if (ZDICT_isError(eSize)) return eSize;
        hSize += eSize;
    }

    /* add dictionary header (after entropy tables) */
    MEM_writeLE32(dictBuffer, ZSTD_MAGIC_DICTIONARY);
    {   U64 const randomID = XXH64((char*)dictBuffer + dictBufferCapacity - dictContentSize, dictContentSize, 0);
        U32 const compliantID = (randomID % ((1U<<31)-32768)) + 32768;
        U32 const dictID = params.dictID ? params.dictID : compliantID;
        MEM_writeLE32((char*)dictBuffer+4, dictID);
    }

    if (hSize + dictContentSize < dictBufferCapacity)
        memmove((char*)dictBuffer + hSize, (char*)dictBuffer + dictBufferCapacity - dictContentSize, dictContentSize);
    return MIN(dictBufferCapacity, hSize+dictContentSize);
}